

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmChkCmp2<(moira::Instr)145,(moira::Mode)5,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  Ea<(moira::Mode)5,_4> src;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  local_40 = op & 7;
  local_44 = *addr;
  *addr = local_44 + 2;
  local_3c = (*this->_vptr_Moira[6])(this);
  local_3c = local_3c & 0xffff;
  if (((uVar5 & 0x7ff) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)145,(moira::Mode)5,4>(this,str,addr,op);
    return;
  }
  cVar4 = 'c';
  lVar7 = 0;
  if (((uVar5 & 0xffff) >> 0xb & 1) == 0) {
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar4;
      cVar4 = "cmp2"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    pcVar6 = str->ptr;
    SVar2 = str->style->syntax;
    str->ptr = pcVar6 + 1;
    if (2 < SVar2 - MOIRA_MIT) {
      *pcVar6 = '.';
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
    }
    *pcVar6 = 'l';
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar3 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar3);
      goto LAB_00372a1e;
    }
  }
  else {
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar4;
      cVar4 = "chk2"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    pcVar6 = str->ptr;
    SVar2 = str->style->syntax;
    str->ptr = pcVar6 + 1;
    if (2 < SVar2 - MOIRA_MIT) {
      *pcVar6 = '.';
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
    }
    *pcVar6 = 'l';
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      iVar3 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar3);
      goto LAB_00372a1e;
    }
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ' ';
LAB_00372a1e:
  StrWriter::operator<<(str,(Ea<(moira::Mode)5,_4> *)&local_44);
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  StrWriter::operator<<(str,(Rn)((uVar5 & 0xffff) >> 0xc));
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar4 = ';';
    lVar7 = 1;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar4;
      cVar4 = "trap%-2s  ; (2+)"[lVar7 + 10];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmChkCmp2(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Rn       ( xxxx____________(ext)      );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {
            
            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    if (ext & 0x0800) {
        str << Ins<Instr::CHK2>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    } else {
        str << Ins<Instr::CMP2>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    }
    str << Av<I, M, S>{};
}